

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FieldOptions::SerializeWithCachedSizesToArray(FieldOptions *this,uint8 *target)

{
  bool bVar1;
  FieldOptions_CType value;
  int iVar2;
  uint32 uVar3;
  char *data;
  string *str;
  UninterpretedOption *this_00;
  uint8 *puVar4;
  UnknownFieldSet *pUVar5;
  int local_204;
  byte *pbStack_200;
  int i;
  uint8 *target_local;
  FieldOptions *this_local;
  byte *local_a0;
  uint8 *local_88;
  byte *local_70;
  byte *local_58;
  byte *local_40;
  byte *local_28;
  byte *local_10;
  
  bVar1 = has_ctype(this);
  pbStack_200 = target;
  if (bVar1) {
    value = ctype(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_88 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_88 = target + 2;
    }
    else {
      local_88 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    pbStack_200 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,local_88);
  }
  bVar1 = has_packed(this);
  if (bVar1) {
    bVar1 = packed(this);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_200 = (byte)uVar3;
      local_28 = pbStack_200 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_200 = (byte)uVar3 | 0x80;
      pbStack_200[1] = (byte)(uVar3 >> 7);
      local_28 = pbStack_200 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_200);
    }
    pbStack_200 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_28);
  }
  bVar1 = has_deprecated(this);
  if (bVar1) {
    bVar1 = deprecated(this);
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_200 = (byte)uVar3;
      local_40 = pbStack_200 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_200 = (byte)uVar3 | 0x80;
      pbStack_200[1] = (byte)(uVar3 >> 7);
      local_40 = pbStack_200 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_200);
    }
    pbStack_200 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_40);
  }
  bVar1 = has_lazy(this);
  if (bVar1) {
    bVar1 = lazy(this);
    uVar3 = internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_200 = (byte)uVar3;
      local_58 = pbStack_200 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_200 = (byte)uVar3 | 0x80;
      pbStack_200[1] = (byte)(uVar3 >> 7);
      local_58 = pbStack_200 + 2;
    }
    else {
      local_58 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_200);
    }
    pbStack_200 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_58);
  }
  bVar1 = has_experimental_map_key(this);
  if (bVar1) {
    experimental_map_key_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    experimental_map_key_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,iVar2,SERIALIZE);
    str = experimental_map_key_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(9,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_200 = (byte)uVar3;
      local_a0 = pbStack_200 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_200 = (byte)uVar3 | 0x80;
      pbStack_200[1] = (byte)(uVar3 >> 7);
      local_a0 = pbStack_200 + 2;
    }
    else {
      local_a0 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_200);
    }
    uVar3 = std::__cxx11::string::size();
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_a0);
    pbStack_200 = io::CodedOutputStream::WriteStringToArray(str,puVar4);
  }
  bVar1 = has_weak(this);
  if (bVar1) {
    bVar1 = weak(this);
    uVar3 = internal::WireFormatLite::MakeTag(10,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_200 = (byte)uVar3;
      local_70 = pbStack_200 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_200 = (byte)uVar3 | 0x80;
      pbStack_200[1] = (byte)(uVar3 >> 7);
      local_70 = pbStack_200 + 2;
    }
    else {
      local_70 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_200);
    }
    pbStack_200 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_70);
  }
  for (local_204 = 0; iVar2 = uninterpreted_option_size(this), local_204 < iVar2;
      local_204 = local_204 + 1) {
    this_00 = uninterpreted_option(this,local_204);
    uVar3 = internal::WireFormatLite::MakeTag(999,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_200 = (byte)uVar3;
      local_10 = pbStack_200 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_200 = (byte)uVar3 | 0x80;
      pbStack_200[1] = (byte)(uVar3 >> 7);
      local_10 = pbStack_200 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_200);
    }
    uVar3 = UninterpretedOption::GetCachedSize(this_00);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    pbStack_200 = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,puVar4);
  }
  pbStack_200 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                          (&this->_extensions_,1000,0x20000000,pbStack_200);
  pUVar5 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar5);
  if (!bVar1) {
    pUVar5 = unknown_fields(this);
    pbStack_200 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar5,pbStack_200);
  }
  return pbStack_200;
}

Assistant:

::google::protobuf::uint8* FieldOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (has_ctype()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->ctype(), target);
  }

  // optional bool packed = 2;
  if (has_packed()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->packed(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if (has_deprecated()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->deprecated(), target);
  }

  // optional bool lazy = 5 [default = false];
  if (has_lazy()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(5, this->lazy(), target);
  }

  // optional string experimental_map_key = 9;
  if (has_experimental_map_key()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->experimental_map_key().data(), this->experimental_map_key().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        9, this->experimental_map_key(), target);
  }

  // optional bool weak = 10 [default = false];
  if (has_weak()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->weak(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}